

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O1

void __thiscall ezexample::ezexample(ezexample *this,vw *this_vw,bool multiline,vw *this_vw_parser)

{
  example *ec;
  
  (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->vw_ref = this_vw;
  if (this_vw_parser == (vw *)0x0) {
    this_vw_parser = this_vw;
  }
  this->vw_par_ref = this_vw_parser;
  this->is_multiline = multiline;
  this->str[0] = '\0';
  this->str[1] = '\0';
  this->current_seed = 0;
  memset(&this->quadratic_features_num,0,0x10d);
  this->example_changed_since_prediction = true;
  (this->example_copies)._begin = (example **)0x0;
  (this->example_copies)._end = (example **)0x0;
  (this->example_copies).end_array = (example **)0x0;
  (this->example_copies).erase_count = 0;
  ec = get_new_example(this);
  this->ec = ec;
  this->we_create_ec = true;
  if (this->vw_ref->add_constant == true) {
    VW::add_constant_feature(this->vw_ref,ec);
  }
  return;
}

Assistant:

ezexample(vw* this_vw, bool multiline = false, vw* this_vw_parser = nullptr)
  {
    setup_new_ezexample(this_vw, multiline, this_vw_parser);
    example_copies = v_init<example*>();
    ec = get_new_example();
    we_create_ec = true;

    if (vw_ref->add_constant)
      VW::add_constant_feature(*vw_ref, ec);
  }